

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O0

void __thiscall MT32Emu::TVF::startRamp(TVF *this,Bit8u newTarget,Bit8u newIncrement,int newPhase)

{
  int newPhase_local;
  Bit8u newIncrement_local;
  Bit8u newTarget_local;
  TVF *this_local;
  
  this->target = newTarget;
  this->phase = newPhase;
  LA32Ramp::startRamp(this->cutoffModifierRamp,newTarget,newIncrement);
  return;
}

Assistant:

void TVF::startRamp(Bit8u newTarget, Bit8u newIncrement, int newPhase) {
	target = newTarget;
	phase = newPhase;
	cutoffModifierRamp->startRamp(newTarget, newIncrement);
#if MT32EMU_MONITOR_TVF >= 1
	partial->getSynth()->printDebug("[+%lu] [Partial %d] TVF,ramp,%x,%s%x,%d", partial->debugGetSampleNum(), partial->debugGetPartialNum(), newTarget, (newIncrement & 0x80) ? "-" : "+", (newIncrement & 0x7F), newPhase);
#endif
}